

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void free_http_proto_data(mg_connection *nc)

{
  byte *pbVar1;
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)nc->proto_data;
  if (__ptr != (undefined8 *)0x0) {
    if ((FILE *)*__ptr != (FILE *)0x0) {
      fclose((FILE *)*__ptr);
    }
    if (__ptr[4] != 0) {
      pbVar1 = (byte *)(__ptr[4] + 0xc9);
      *pbVar1 = *pbVar1 | 8;
    }
    free(__ptr);
    nc->proto_data = (void *)0x0;
  }
  return;
}

Assistant:

static void free_http_proto_data(struct mg_connection *nc) {
    struct proto_data_http *dp = (struct proto_data_http *) nc->proto_data;
    if (dp != NULL) {
        if (dp->fp != NULL) {
            fclose(dp->fp);
        }
        if (dp->cgi_nc != NULL) {
            dp->cgi_nc->flags |= MG_F_CLOSE_IMMEDIATELY;
        }
        MG_FREE(dp);
        nc->proto_data = NULL;
    }
}